

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5CsrPoslist(Fts5Cursor *pCsr,int iPhrase,u8 **pa,int *pn)

{
  int *piVar1;
  Fts5Expr *pFVar2;
  Fts5Config *pConfig;
  long *plVar3;
  Fts5Colset *pFVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  void *__s;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  Fts5Sorter *pSorter;
  ulong uVar11;
  Fts5Sorter *pFVar12;
  long in_FS_OFFSET;
  int n;
  char *z;
  Fts5Expr *local_50;
  void *local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = 0x19;
  if (-1 < iPhrase) {
    pFVar2 = pCsr->pExpr;
    if (pFVar2 == (Fts5Expr *)0x0) {
      iVar6 = 0;
    }
    else {
      iVar6 = pFVar2->nPhrase;
    }
    if (iPhrase < iVar6) {
      pFVar12 = pCsr->pSorter;
      pConfig = (Fts5Config *)(pCsr->base).pVtab[1].pModule;
      if (pConfig->eDetail == 0) {
        if ((pCsr->csrflags & 0x40) != 0) {
          iVar7 = 0;
LAB_001d01ba:
          *(byte *)&pCsr->csrflags = (byte)pCsr->csrflags & 0xbf;
          if (iVar7 != 0) goto LAB_001d01c1;
          pFVar12 = pCsr->pSorter;
        }
LAB_001d01d0:
        if ((pFVar12 != (Fts5Sorter *)0x0) && (pConfig->eDetail == 0)) {
          iVar7 = 0;
          iVar6 = 0;
          if (iPhrase != 0) {
            iVar6 = pFVar12->aIdx[(long)iPhrase + -1];
          }
          *pn = pFVar12->aIdx[(uint)iPhrase] - iVar6;
          *pa = pFVar12->aPoslist + iVar6;
          goto LAB_001d01ec;
        }
        iVar7 = sqlite3Fts5ExprPoslist(pCsr->pExpr,iPhrase,pa);
        *pn = iVar7;
      }
      else {
        if ((pConfig->eContent & 0xfffffffdU) != 1) {
          if ((pCsr->csrflags & 0x40) != 0) {
            __s = sqlite3_malloc64((long)pFVar2->nPhrase << 4);
            if (__s == (void *)0x0) {
              iVar7 = 7;
            }
            else {
              uVar8 = 0;
              memset(__s,0,(long)pFVar2->nPhrase << 4);
              uVar11 = (ulong)(uint)pFVar2->nPhrase;
              if (pFVar2->nPhrase < 1) {
                uVar11 = uVar8;
              }
              for (; uVar11 * 8 != uVar8; uVar8 = uVar8 + 8) {
                plVar3 = *(long **)((long)pFVar2->apExprPhrase + uVar8);
                if ((pFVar12 == (Fts5Sorter *)0x0) &&
                   ((((int)plVar3[2] == 0 || (*(long *)(*plVar3 + 0x18) != pFVar2->pRoot->iRowid))
                    || (*(int *)(*plVar3 + 4) != 0)))) {
                  *(undefined4 *)((long)__s + uVar8 * 2 + 0xc) = 1;
                }
                else {
                  *(undefined4 *)(plVar3 + 2) = 0;
                }
              }
              iVar7 = fts5SeekCursor(pCsr,0);
            }
            uVar11 = 0;
            while (((long)uVar11 < (long)pConfig->nCol && (iVar7 == 0))) {
              z = (char *)0x0;
              n = 0;
              iVar7 = fts5TextFromStmt(pConfig,pCsr->pStmt,(int)uVar11,&z,&n);
              if (iVar7 == 0) {
                local_50 = pCsr->pExpr;
                local_40 = (uVar11 << 0x20) + -1;
                uVar5 = local_50->nPhrase;
                if (local_50->nPhrase < 1) {
                  uVar5 = 0;
                }
                for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
                  pFVar4 = local_50->apExprPhrase[uVar8]->pNode->pNear->pColset;
                  if (pFVar4 != (Fts5Colset *)0x0) {
                    uVar9 = (ulong)(uint)pFVar4->nCol;
                    if (pFVar4->nCol < 1) {
                      uVar9 = 0;
                    }
                    uVar10 = 0;
                    do {
                      if (uVar9 == uVar10) goto LAB_001d0133;
                      piVar1 = pFVar4->aiCol + uVar10;
                      uVar10 = uVar10 + 1;
                    } while (uVar11 != (uint)*piVar1);
                  }
                  if (*(int *)((long)__s + uVar8 * 0x10 + 0xc) == 0) {
                    *(undefined4 *)((long)__s + uVar8 * 0x10 + 8) = 1;
                  }
                  else {
LAB_001d0133:
                    *(undefined4 *)((long)__s + uVar8 * 0x10 + 8) = 0;
                  }
                }
                local_48 = __s;
                iVar7 = sqlite3Fts5Tokenize(pConfig,4,z,n,&local_50,fts5ExprPopulatePoslistsCb);
              }
              (pConfig->t).pLocale = (char *)0x0;
              (pConfig->t).nLocale = 0;
              uVar11 = uVar11 + 1;
            }
            sqlite3_free(__s);
            if (pCsr->pSorter != (Fts5Sorter *)0x0) {
              fts5ExprCheckPoslists(pCsr->pExpr->pRoot,pCsr->pSorter->iRowid);
            }
            goto LAB_001d01ba;
          }
          goto LAB_001d01d0;
        }
        *pa = (u8 *)0x0;
        *pn = 0;
      }
      iVar7 = 0;
      goto LAB_001d01ec;
    }
  }
LAB_001d01c1:
  *pa = (u8 *)0x0;
  *pn = 0;
LAB_001d01ec:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

static int fts5CsrPoslist(
  Fts5Cursor *pCsr,               /* Fts5 cursor object */
  int iPhrase,                    /* Phrase to find position list for */
  const u8 **pa,                  /* OUT: Pointer to position list buffer */
  int *pn                         /* OUT: Size of (*pa) in bytes */
){
  Fts5Config *pConfig = ((Fts5Table*)(pCsr->base.pVtab))->pConfig;
  int rc = SQLITE_OK;
  int bLive = (pCsr->pSorter==0);

  if( iPhrase<0 || iPhrase>=sqlite3Fts5ExprPhraseCount(pCsr->pExpr) ){
    rc = SQLITE_RANGE;
  }else if( pConfig->eDetail!=FTS5_DETAIL_FULL
         && fts5IsContentless((Fts5FullTable*)pCsr->base.pVtab, 1)
  ){
    *pa = 0;
    *pn = 0;
    return SQLITE_OK;
  }else if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_POSLIST) ){
    if( pConfig->eDetail!=FTS5_DETAIL_FULL ){
      Fts5PoslistPopulator *aPopulator;
      int i;

      aPopulator = sqlite3Fts5ExprClearPoslists(pCsr->pExpr, bLive);
      if( aPopulator==0 ) rc = SQLITE_NOMEM;
      if( rc==SQLITE_OK ){
        rc = fts5SeekCursor(pCsr, 0);
      }
      for(i=0; i<pConfig->nCol && rc==SQLITE_OK; i++){
        const char *z = 0;
        int n = 0;
        rc = fts5TextFromStmt(pConfig, pCsr->pStmt, i, &z, &n);
        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5ExprPopulatePoslists(
              pConfig, pCsr->pExpr, aPopulator, i, z, n
          );
        }
        sqlite3Fts5ClearLocale(pConfig);
      }
      sqlite3_free(aPopulator);

      if( pCsr->pSorter ){
        sqlite3Fts5ExprCheckPoslists(pCsr->pExpr, pCsr->pSorter->iRowid);
      }
    }
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_POSLIST);
  }

  if( rc==SQLITE_OK ){
    if( pCsr->pSorter && pConfig->eDetail==FTS5_DETAIL_FULL ){
      Fts5Sorter *pSorter = pCsr->pSorter;
      int i1 = (iPhrase==0 ? 0 : pSorter->aIdx[iPhrase-1]);
      *pn = pSorter->aIdx[iPhrase] - i1;
      *pa = &pSorter->aPoslist[i1];
    }else{
      *pn = sqlite3Fts5ExprPoslist(pCsr->pExpr, iPhrase, pa);
    }
  }else{
    *pa = 0;
    *pn = 0;
  }

  return rc;
}